

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O3

void soul::heart::Checker::checkConnections(Program *program)

{
  EndpointType type;
  pointer ppVar1;
  Module *pMVar2;
  pointer ppVar3;
  pointer pcVar4;
  Connection *pCVar5;
  ulong uVar6;
  ProcessorInstance *pPVar7;
  pointer ppVar8;
  size_type sVar9;
  pointer ppVar10;
  bool bVar11;
  long *plVar12;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer ppVar14;
  IODeclaration *destInput;
  pointer ppVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pool_ref<soul::heart::OutputDeclaration> *f_1;
  pointer ppVar16;
  pool_ref<soul::heart::InputDeclaration> *f;
  IODeclaration *sourceOutput;
  pointer ppVar17;
  string_view other;
  string_view other_00;
  string_view other_01;
  string_view other_02;
  string_view other_03;
  string_view other_04;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  pool_ptr<soul::Module> sourceModule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string destDescription;
  string sourceDescription;
  ulong local_288;
  ulong local_280;
  CompileMessage local_260;
  CompileMessage local_228;
  CompileMessage local_1f0;
  CompileMessage local_1b8;
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  ppVar14 = (program->pimpl->modules).
            super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (program->pimpl->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar14 == ppVar1) {
      return;
    }
    pMVar2 = ppVar14->object;
    if (pMVar2->moduleType == graphModule) {
      ppVar3 = (pMVar2->connections).
               super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar15 = (pMVar2->connections).
                     super__Vector_base<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
          ppVar15 = ppVar15 + 1) {
        sourceDescription._M_dataplus._M_p = (pointer)&sourceDescription.field_2;
        pcVar4 = (ppVar15->object->source).endpointName._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sourceDescription,pcVar4,
                   pcVar4 + (ppVar15->object->source).endpointName._M_string_length);
        pcVar4 = (ppVar15->object->dest).endpointName._M_dataplus._M_p;
        destDescription._M_dataplus._M_p = (pointer)&destDescription.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&destDescription,pcVar4,
                   pcVar4 + (ppVar15->object->dest).endpointName._M_string_length);
        pCVar5 = ppVar15->object;
        if ((pCVar5->delayLength).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged == true) {
          uVar6 = (pCVar5->delayLength).super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload._M_value;
          if ((long)uVar6 < 1) {
            CompileMessageHelpers::createMessage<>
                      (&local_68,syntax,error,"A delay line length must be greater than zero");
            CodeLocation::throwError(&(pCVar5->super_Object).location,&local_68);
          }
          if (0x40000 < uVar6) {
            CompileMessageHelpers::createMessage<>
                      (&local_a0,syntax,error,"Illegal delay line length");
            CodeLocation::throwError(&(pCVar5->super_Object).location,&local_a0);
          }
        }
        pPVar7 = (pCVar5->source).processor.object;
        if (pPVar7 == (ProcessorInstance *)0x0) {
          ppVar17 = (ppVar14->object->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = (ppVar14->object->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_280 = 1;
          if (ppVar17 != ppVar10) {
            pcVar4 = (pCVar5->source).endpointName._M_dataplus._M_p;
            sVar9 = (pCVar5->source).endpointName._M_string_length;
            do {
              other_00._M_str = pcVar4;
              other_00._M_len = sVar9;
              bVar11 = Identifier::operator==(&(ppVar17->object->super_IODeclaration).name,other_00)
              ;
              if (bVar11) {
                sourceOutput = &ppVar17->object->super_IODeclaration;
                goto LAB_0022adef;
              }
              ppVar17 = ppVar17 + 1;
            } while (ppVar17 != ppVar10);
          }
          sourceOutput = (IODeclaration *)0x0;
LAB_0022adef:
          uVar18 = 0;
        }
        else {
          Program::ProgramImpl::findModuleWithName
                    ((ProgramImpl *)&sourceModule,(string *)program->pimpl);
          pCVar5 = ppVar15->object;
          if (sourceModule.object == (Module *)0x0) {
            CompileMessageHelpers::createMessage<std::__cxx11::string&>
                      (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a21b5,
                       (char *)&pPVar7->sourceName,in_R9);
            CodeLocation::throwError(&(pCVar5->super_Object).location,&local_d8);
          }
          ppVar16 = ((sourceModule.object)->outputs).
                    super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 = ((sourceModule.object)->outputs).
                   super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar16 != ppVar8) {
            pcVar4 = (pCVar5->source).endpointName._M_dataplus._M_p;
            sVar9 = (pCVar5->source).endpointName._M_string_length;
            do {
              other._M_str = pcVar4;
              other._M_len = sVar9;
              bVar11 = Identifier::operator==(&(ppVar16->object->super_IODeclaration).name,other);
              if (bVar11) {
                sourceOutput = &ppVar16->object->super_IODeclaration;
                goto LAB_0022aca3;
              }
              ppVar16 = ppVar16 + 1;
            } while (ppVar16 != ppVar8);
          }
          sourceOutput = (IODeclaration *)0x0;
LAB_0022aca3:
          local_280 = 1;
          if ((ppVar15->object->source).endpointIndex.
              super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            local_280 = (ulong)pPVar7->arraySize;
          }
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          pcVar4 = (pPVar7->instanceName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__str,pcVar4,pcVar4 + (pPVar7->instanceName)._M_string_length);
          std::__cxx11::string::append((char *)&__str);
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&__str,(ulong)sourceDescription._M_dataplus._M_p);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar13) {
            local_2f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2f8.field_2._8_8_ = plVar12[3];
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          }
          else {
            local_2f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2f8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_2f8._M_string_length = plVar12[1];
          *plVar12 = (long)paVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&sourceDescription,(string *)&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,
                            (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (sourceOutput != (IODeclaration *)0x0) goto LAB_0022adef;
          if (sourceModule.object == (Module *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          ppVar17 = ((sourceModule.object)->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = ((sourceModule.object)->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar17 != ppVar10) {
            pcVar4 = (ppVar15->object->source).endpointName._M_dataplus._M_p;
            sVar9 = (ppVar15->object->source).endpointName._M_string_length;
            do {
              other_01._M_str = pcVar4;
              other_01._M_len = sVar9;
              bVar11 = Identifier::operator==(&(ppVar17->object->super_IODeclaration).name,other_01)
              ;
              if (bVar11) {
                uVar18 = (undefined4)
                         CONCAT71(extraout_var,ppVar17->object != (InputDeclaration *)0x0);
                goto LAB_0022ae0c;
              }
              ppVar17 = ppVar17 + 1;
            } while (ppVar17 != ppVar10);
          }
          uVar18 = 0;
        }
LAB_0022ae0c:
        pCVar5 = ppVar15->object;
        pPVar7 = (pCVar5->dest).processor.object;
        if (pPVar7 == (ProcessorInstance *)0x0) {
          ppVar16 = (ppVar14->object->outputs).
                    super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 = (ppVar14->object->outputs).
                   super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_288 = 1;
          if (ppVar16 == ppVar8) {
            destInput = (IODeclaration *)0x0;
            goto LAB_0022b044;
          }
          pcVar4 = (pCVar5->dest).endpointName._M_dataplus._M_p;
          sVar9 = (pCVar5->dest).endpointName._M_string_length;
          do {
            other_03._M_str = pcVar4;
            other_03._M_len = sVar9;
            bVar11 = Identifier::operator==(&(ppVar16->object->super_IODeclaration).name,other_03);
            if (bVar11) {
              destInput = &ppVar16->object->super_IODeclaration;
              goto LAB_0022b054;
            }
            ppVar16 = ppVar16 + 1;
          } while (ppVar16 != ppVar8);
          destInput = (IODeclaration *)0x0;
LAB_0022b054:
          bVar11 = false;
        }
        else {
          Program::ProgramImpl::findModuleWithName
                    ((ProgramImpl *)&sourceModule,(string *)program->pimpl);
          pCVar5 = ppVar15->object;
          if (sourceModule.object == (Module *)0x0) {
            CompileMessageHelpers::createMessage<std::__cxx11::string&>
                      (&local_110,(CompileMessageHelpers *)0x1,none,0x2a21b5,
                       (char *)&pPVar7->sourceName,in_R9);
            CodeLocation::throwError(&(pCVar5->super_Object).location,&local_110);
          }
          ppVar17 = ((sourceModule.object)->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar10 = ((sourceModule.object)->inputs).
                    super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar17 != ppVar10) {
            pcVar4 = (pCVar5->dest).endpointName._M_dataplus._M_p;
            sVar9 = (pCVar5->dest).endpointName._M_string_length;
            do {
              other_02._M_str = pcVar4;
              other_02._M_len = sVar9;
              bVar11 = Identifier::operator==(&(ppVar17->object->super_IODeclaration).name,other_02)
              ;
              if (bVar11) {
                destInput = &ppVar17->object->super_IODeclaration;
                goto LAB_0022aeef;
              }
              ppVar17 = ppVar17 + 1;
            } while (ppVar17 != ppVar10);
          }
          destInput = (IODeclaration *)0x0;
LAB_0022aeef:
          local_288 = 1;
          if ((ppVar15->object->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
              _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            local_288 = (ulong)pPVar7->arraySize;
          }
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          pcVar4 = (pPVar7->instanceName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__str,pcVar4,pcVar4 + (pPVar7->instanceName)._M_string_length);
          std::__cxx11::string::append((char *)&__str);
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&__str,(ulong)destDescription._M_dataplus._M_p);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar13) {
            local_2f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2f8.field_2._8_8_ = plVar12[3];
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          }
          else {
            local_2f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2f8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_2f8._M_string_length = plVar12[1];
          *plVar12 = (long)paVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&destDescription,(string *)&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,
                            (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (destInput == (IODeclaration *)0x0) {
            if (sourceModule.object == (Module *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            ppVar16 = ((sourceModule.object)->outputs).
                      super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar8 = ((sourceModule.object)->outputs).
                     super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar16 == ppVar8) goto LAB_0022b054;
            pcVar4 = (ppVar15->object->dest).endpointName._M_dataplus._M_p;
            sVar9 = (ppVar15->object->dest).endpointName._M_string_length;
            do {
              other_04._M_str = pcVar4;
              other_04._M_len = sVar9;
              bVar11 = Identifier::operator==(&(ppVar16->object->super_IODeclaration).name,other_04)
              ;
              if (bVar11) {
                bVar11 = ppVar16->object != (OutputDeclaration *)0x0;
                goto LAB_0022b070;
              }
              ppVar16 = ppVar16 + 1;
            } while (ppVar16 != ppVar8);
            bVar11 = false;
          }
          else {
LAB_0022b044:
            bVar11 = false;
          }
        }
LAB_0022b070:
        if (sourceOutput == (IODeclaration *)0x0) {
          pCVar5 = ppVar15->object;
          if ((char)uVar18 == '\0') {
            CompileMessageHelpers::createMessage<std::__cxx11::string&>
                      (&local_228,(CompileMessageHelpers *)0x1,none,0x2a2497,
                       (char *)&sourceDescription,in_R9);
          }
          else {
            CompileMessageHelpers::createMessage<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_228,(CompileMessageHelpers *)0x1,none,0x2a2459,
                       (char *)&sourceDescription,&destDescription,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar18,in_stack_fffffffffffffcd8));
          }
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_228);
        }
        pCVar5 = ppVar15->object;
        if (destInput == (IODeclaration *)0x0) {
          if (bVar11) {
            CompileMessageHelpers::createMessage<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_260,(CompileMessageHelpers *)0x1,none,0x2a24af,
                       (char *)&sourceDescription,&destDescription,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar18,in_stack_fffffffffffffcd8));
          }
          else {
            CompileMessageHelpers::createMessage<std::__cxx11::string&>
                      (&local_260,(CompileMessageHelpers *)0x1,none,0x2a24f1,
                       (char *)&destDescription,in_R9);
          }
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_260);
        }
        if (((pCVar5->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged == true) &&
           (((sourceOutput->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged != true ||
            ((ulong)(sourceOutput->arraySize).super__Optional_base<unsigned_int,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value <=
             (pCVar5->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value)))) {
          CompileMessageHelpers::createMessage<>
                    (&local_148,syntax,error,"Source index out of range");
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_148);
        }
        if (((pCVar5->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload
             .super__Optional_payload_base<unsigned_long>._M_engaged == true) &&
           (((destInput->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged != true ||
            ((ulong)(destInput->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload
                    .super__Optional_payload_base<unsigned_int>._M_payload._M_value <=
             (pCVar5->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload
             .super__Optional_payload_base<unsigned_long>._M_payload._M_value)))) {
          CompileMessageHelpers::createMessage<>
                    (&local_180,syntax,error,"Destination index out of range");
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_180);
        }
        type = sourceOutput->endpointType;
        if (type != destInput->endpointType) {
          local_2f8._M_dataplus._M_p = getEndpointTypeName(type);
          __str._M_dataplus._M_p = getEndpointTypeName(destInput->endpointType);
          CompileMessageHelpers::
          createMessage<std::__cxx11::string&,char_const*,std::__cxx11::string&,char_const*>
                    (&local_1b8,(CompileMessageHelpers *)0x1,none,0x2a2547,
                     (char *)&sourceDescription,&local_2f8,(char **)&destDescription,&__str,
                     (char **)CONCAT44(uVar18,in_stack_fffffffffffffcd8));
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_1b8);
        }
        bVar11 = areConnectionTypesCompatible
                           (type == event,sourceOutput,local_280,destInput,local_288);
        if (!bVar11) {
          pCVar5 = ppVar15->object;
          IODeclaration::getTypesDescription_abi_cxx11_(&local_2f8,sourceOutput);
          IODeclaration::getTypesDescription_abi_cxx11_(&__str,destInput);
          CompileMessageHelpers::
          createMessage<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string>
                    (&local_1f0,(CompileMessageHelpers *)0x1,none,0x2a2547,
                     (char *)&sourceDescription,&local_2f8,&destDescription,&__str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar18,in_stack_fffffffffffffcd8));
          CodeLocation::throwError(&(pCVar5->super_Object).location,&local_1f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destDescription._M_dataplus._M_p != &destDescription.field_2) {
          operator_delete(destDescription._M_dataplus._M_p,
                          destDescription.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceDescription._M_dataplus._M_p != &sourceDescription.field_2) {
          operator_delete(sourceDescription._M_dataplus._M_p,
                          sourceDescription.field_2._M_allocated_capacity + 1);
        }
      }
    }
    ppVar14 = ppVar14 + 1;
  } while( true );
}

Assistant:

static void checkConnections (const Program& program)
    {
        for (auto& m : program.getModules())
        {
            if (m->isGraph())
            {
                for (auto& conn : m->connections)
                {
                    pool_ptr<heart::IODeclaration> sourceOutput, destInput;
                    bool sourceWasAnInput = false, destWasAnOutput = false;
                    size_t sourceInstanceArraySize = 1, destInstanceArraySize = 1;
                    auto sourceDescription = conn->source.endpointName;
                    auto destDescription   = conn->dest.endpointName;

                    if (conn->delayLength)
                    {
                        if (conn->delayLength < 1)
                            conn->location.throwError (Errors::delayLineTooShort());

                        if (conn->delayLength > (int32_t) AST::maxDelayLineLength)
                            conn->location.throwError (Errors::delayLineTooLong());
                    }

                    if (auto sourceProcessor = conn->source.processor)
                    {
                        auto sourceModule = program.findModuleWithName (sourceProcessor->sourceName);

                        if (sourceModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (sourceProcessor->sourceName));

                        sourceOutput = sourceModule->findOutput (conn->source.endpointName);
                        sourceInstanceArraySize = conn->source.endpointIndex.has_value() ? 1 : sourceProcessor->arraySize;
                        sourceDescription = sourceProcessor->instanceName + "." + sourceDescription;

                        if (sourceOutput == nullptr)
                            sourceWasAnInput = sourceModule->findInput (conn->source.endpointName) != nullptr;
                    }
                    else
                    {
                        sourceOutput = m->findInput (conn->source.endpointName);
                    }

                    if (auto destProcessor = conn->dest.processor)
                    {
                        auto destModule = program.findModuleWithName (destProcessor->sourceName);

                        if (destModule == nullptr)
                            conn->location.throwError (Errors::cannotFindProcessor (destProcessor->sourceName));

                        destInput = destModule->findInput (conn->dest.endpointName);
                        destInstanceArraySize = conn->dest.endpointIndex.has_value() ? 1 : destProcessor->arraySize;
                        destDescription = destProcessor->instanceName + "." + destDescription;

                        if (destInput == nullptr)
                            destWasAnOutput = destModule->findOutput (conn->dest.endpointName) != nullptr;
                    }
                    else
                    {
                        destInput = m->findOutput (conn->dest.endpointName);
                    }

                    if (sourceOutput == nullptr)
                        conn->location.throwError (sourceWasAnInput ? Errors::cannotConnectFromAnInput (sourceDescription, destDescription)
                                                                    : Errors::cannotFindSource (sourceDescription));

                    if (destInput == nullptr)
                        conn->location.throwError (destWasAnOutput ? Errors::cannotConnectToAnOutput (sourceDescription, destDescription)
                                                                   : Errors::cannotFindDestination (destDescription));

                    if (conn->source.endpointIndex && sourceOutput->arraySize <= conn->source.endpointIndex)
                        conn->location.throwError (Errors::sourceEndpointIndexOutOfRange());

                    if (conn->dest.endpointIndex && destInput->arraySize <= conn->dest.endpointIndex)
                        conn->location.throwError (Errors::destinationEndpointIndexOutOfRange());

                    if (sourceOutput->endpointType != destInput->endpointType)
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, getEndpointTypeName (sourceOutput->endpointType),
                                                                          destDescription, getEndpointTypeName (destInput->endpointType)));

                    if (! areConnectionTypesCompatible (sourceOutput->isEventEndpoint(),
                                                        *sourceOutput,
                                                        sourceInstanceArraySize,
                                                        *destInput,
                                                        destInstanceArraySize))
                        conn->location.throwError (Errors::cannotConnect (sourceDescription, sourceOutput->getTypesDescription(),
                                                                          destDescription, destInput->getTypesDescription()));
                }
            }
        }
    }